

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O1

RowGroupCollection * __thiscall
duckdb::LocalTableStorage::GetOptimisticCollection
          (LocalTableStorage *this,PhysicalIndex collection_index)

{
  int iVar1;
  reference this_00;
  type pRVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->collections_lock);
  if (iVar1 == 0) {
    this_00 = vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_true>
              ::operator[](&this->optimistic_collections,collection_index.index);
    pRVar2 = unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
             ::operator*(this_00);
    pthread_mutex_unlock((pthread_mutex_t *)&this->collections_lock);
    return pRVar2;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

RowGroupCollection &LocalTableStorage::GetOptimisticCollection(const PhysicalIndex collection_index) {
	lock_guard<mutex> l(collections_lock);
	auto &collection = optimistic_collections[collection_index.index];
	return *collection;
}